

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void extra_close_record(ctl_extr_rec *ctl,int ce_size)

{
  int local_18;
  int padding;
  int ce_size_local;
  ctl_extr_rec *ctl_local;
  
  local_18 = 0;
  if (0 < ce_size) {
    extra_tell_used_size(ctl,ce_size);
  }
  if ((ctl->cur_len & 1U) != 0) {
    ctl->cur_len = ctl->cur_len + 1;
    if (ctl->bp != (uchar *)0x0) {
      ctl->bp[ctl->cur_len] = '\0';
    }
    local_18 = 1;
  }
  if (ctl->use_extr == 0) {
    ctl->dr_len = ctl->cur_len;
  }
  else if (ctl->ce_ptr != (uchar *)0x0) {
    set_SUSP_CE(ctl->ce_ptr,ctl->extr_loc,ctl->extr_off,ctl->cur_len - local_18);
  }
  return;
}

Assistant:

static void
extra_close_record(struct ctl_extr_rec *ctl, int ce_size)
{
	int padding = 0;

	if (ce_size > 0)
		extra_tell_used_size(ctl, ce_size);
	/* Padding. */
	if (ctl->cur_len & 0x01) {
		ctl->cur_len++;
		if (ctl->bp != NULL)
			ctl->bp[ctl->cur_len] = 0;
		padding = 1;
	}
	if (ctl->use_extr) {
		if (ctl->ce_ptr != NULL)
			set_SUSP_CE(ctl->ce_ptr, ctl->extr_loc,
			    ctl->extr_off, ctl->cur_len - padding);
	} else
		ctl->dr_len = ctl->cur_len;
}